

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void live_mode_cb(Fl_Button *o,void *param_2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Fl_Window *this;
  Fl_Group *this_00;
  Fl_Widget *this_01;
  Fl_Button *this_02;
  int local_60;
  int local_5c;
  int MH;
  int MW;
  int mh;
  int mw;
  Fl_Window_Type *w_1;
  Fl_Button *btn;
  Fl_Box *rsz_dummy;
  Fl_Group *rsz;
  int h;
  int w;
  void *param_4_local;
  Fl_Button *o_local;
  
  param_4_local = o;
  if (o == (Fl_Button *)0x0) {
    param_4_local = wLiveMode;
    Fl_Button::value(wLiveMode,0);
  }
  cVar1 = Fl_Button::value((Fl_Button *)param_4_local);
  if (cVar1 == '\0') {
    if (live_mode_cb::live_type != (Fl_Type *)0x0) {
      (*live_mode_cb::live_type->_vptr_Fl_Type[0x14])();
    }
    if (live_mode_cb::live_window != (Fl_Window *)0x0) {
      (*(live_mode_cb::live_window->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
      Fl::delete_widget((Fl_Widget *)live_mode_cb::live_window);
    }
    live_mode_cb::live_type = (Fl_Type *)0x0;
    live_mode_cb::live_widget = (Fl_Widget *)0x0;
    live_mode_cb::live_window = (Fl_Window *)0x0;
  }
  else if (numselected == 1) {
    Fl_Group::current((Fl_Group *)0x0);
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x13])();
    live_mode_cb::live_widget = (Fl_Widget *)CONCAT44(extraout_var,iVar2);
    if (live_mode_cb::live_widget == (Fl_Widget *)0x0) {
      Fl_Button::value((Fl_Button *)param_4_local,0);
    }
    else {
      live_mode_cb::live_type = &current_widget->super_Fl_Type;
      Fl_Group::current((Fl_Group *)0x0);
      iVar2 = Fl_Widget::w(live_mode_cb::live_widget);
      iVar3 = Fl_Widget::h(live_mode_cb::live_widget);
      this = (Fl_Window *)operator_new(0xf0);
      Fl_Double_Window::Fl_Double_Window
                ((Fl_Double_Window *)this,iVar2 + 0x14,iVar3 + 0x37,"Fluid Live Mode Widget");
      live_mode_cb::live_window = this;
      Fl_Widget::box((Fl_Widget *)this,FL_FLAT_BOX);
      Fl_Widget::color((Fl_Widget *)live_mode_cb::live_window,0x3f);
      this_00 = (Fl_Group *)operator_new(0xa0);
      Fl_Group::Fl_Group(this_00,0,iVar3 + 0x14,0x82,0x23,(char *)0x0);
      Fl_Widget::box((Fl_Widget *)this_00,FL_NO_BOX);
      this_01 = (Fl_Widget *)operator_new(0x78);
      Fl_Box::Fl_Box((Fl_Box *)this_01,0x6e,iVar3 + 0x14,1,0x19,(char *)0x0);
      Fl_Widget::box(this_01,FL_NO_BOX);
      Fl_Group::resizable(this_00,this_01);
      this_02 = (Fl_Button *)operator_new(0x80);
      Fl_Button::Fl_Button(this_02,10,iVar3 + 0x14,100,0x19,"Exit Live Mode");
      Fl_Widget::labelsize((Fl_Widget *)this_02,0xc);
      Fl_Widget::callback((Fl_Widget *)this_02,leave_live_mode_cb);
      Fl_Group::end(this_00);
      Fl_Group::add(&live_mode_cb::live_window->super_Fl_Group,live_mode_cb::live_widget);
      Fl_Widget::position(live_mode_cb::live_widget,10,10);
      Fl_Group::resizable(&live_mode_cb::live_window->super_Fl_Group,live_mode_cb::live_widget);
      Fl_Window::set_modal(live_mode_cb::live_window);
      Fl_Widget::callback((Fl_Widget *)live_mode_cb::live_window,leave_live_mode_cb);
      iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
      if (iVar2 != 0) {
        MW = current_widget[1].super_Fl_Type.level;
        if (0 < MW) {
          MW = MW + 0x14;
        }
        MH = *(int *)&current_widget[1].super_Fl_Type.field_0x4c;
        if (0 < MH) {
          MH = MH + 0x37;
        }
        local_5c = *(int *)&current_widget[1].super_Fl_Type.next;
        if (0 < local_5c) {
          local_5c = local_5c + 0x14;
        }
        local_60 = *(int *)((long)&current_widget[1].super_Fl_Type.next + 4);
        if (2 < local_60) {
          local_60 = local_60 + 0x37;
        }
        if ((((MW != 0) || (MH != 0)) || (local_5c != 0)) || (local_60 != 0)) {
          Fl_Window::size_range(live_mode_cb::live_window,MW,MH,local_5c,local_60,0,0,0);
        }
      }
      (*(live_mode_cb::live_window->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
    }
  }
  else {
    Fl_Button::value((Fl_Button *)param_4_local,0);
  }
  return;
}

Assistant:

void live_mode_cb(Fl_Button*o,void *) {
  /// \todo live mode should end gracefully when the application quits
  ///       or when the user closes the live widget
  static Fl_Type *live_type = 0L;
  static Fl_Widget *live_widget = 0L;
  static Fl_Window *live_window = 0L;
  // if 'o' is 0, we must quit live mode
  if (!o) {
    o = wLiveMode;
    o->value(0);
  }
  if (o->value()) {
    if (numselected == 1) {
      Fl_Group::current(0L);
      live_widget = current_widget->enter_live_mode(1);
      if (live_widget) {
        live_type = current_widget;
        Fl_Group::current(0);
        int w = live_widget->w();
        int h = live_widget->h();
        live_window = new Fl_Double_Window(w+20, h+55, "Fluid Live Mode Widget");
        live_window->box(FL_FLAT_BOX);
        live_window->color(FL_GREEN);
        Fl_Group *rsz = new Fl_Group(0, h+20, 130, 35);
        rsz->box(FL_NO_BOX);
        Fl_Box *rsz_dummy = new Fl_Box(110, h+20, 1, 25);
        rsz_dummy->box(FL_NO_BOX);
        rsz->resizable(rsz_dummy);
        Fl_Button *btn = new Fl_Button(10, h+20, 100, 25, "Exit Live Mode");
        btn->labelsize(12);
        btn->callback(leave_live_mode_cb);
        rsz->end();
        live_window->add(live_widget);
        live_widget->position(10, 10);
        live_window->resizable(live_widget);
        live_window->set_modal(); // block all other UI
        live_window->callback(leave_live_mode_cb);
        if (current_widget->is_window()) {
          Fl_Window_Type *w = (Fl_Window_Type*)current_widget;
          int mw = w->sr_min_w; if (mw>0) mw += 20;
          int mh = w->sr_min_h; if (mh>0) mh += 55;
          int MW = w->sr_max_w; if (MW>0) MW += 20; 
          int MH = w->sr_max_h; if (MH>2) MH += 55;
          if (mw || mh || MW || MH)
            live_window->size_range(mw, mh, MW, MH);
        }
        live_window->show();
      } else o->value(0);
    } else o->value(0);
  } else {
    if (live_type)
      live_type->leave_live_mode();
    if (live_window) {
      live_window->hide();
      Fl::delete_widget(live_window);
    }
    live_type = 0L;
    live_widget = 0L;
    live_window = 0L;
  }
}